

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O1

void * matras_touch_no_check(matras *m,matras_id_t id)

{
  matras_id_t *pmVar1;
  byte bVar2;
  uint uVar3;
  matras_view *pmVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  matras_allocator *pmVar7;
  undefined8 *__dest;
  undefined8 *puVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  
  if ((m->head).block_count <= (ulong)id) {
    __assert_fail("id < m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/matras.h"
                  ,0x178,"_Bool matras_needs_touch(struct matras *, matras_id_t)");
  }
  pmVar4 = (m->head).prev_view;
  if (((pmVar4 == (matras_view *)0x0) || (pmVar4->block_count == 0)) ||
     (bVar2 = (byte)m->shift2,
     (int)pmVar4->block_count - 1U >> (bVar2 & 0x1f) < id >> (bVar2 & 0x1f))) {
    __assert_fail("matras_needs_touch(m, id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1cd,"void *matras_touch_no_check(struct matras *, matras_id_t)");
  }
  uVar10 = id >> ((byte)m->shift1 & 0x1f);
  uVar11 = (m->mask1 & id) >> ((byte)m->shift2 & 0x1f);
  uVar3 = m->mask2;
  puVar5 = (undefined8 *)(m->head).root;
  puVar6 = (undefined8 *)pmVar4->root;
  puVar8 = puVar5;
  if (puVar5 == puVar6) {
    pmVar7 = m->allocator;
    if (pmVar7->num_reserved_extents < 1) {
      puVar8 = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
    }
    else {
      puVar8 = (undefined8 *)pmVar7->reserved_extents;
      pmVar7->reserved_extents = (void *)*puVar8;
      pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
    }
    if (puVar8 != (undefined8 *)0x0) {
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(puVar8,puVar5,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      (m->head).root = puVar8;
      goto LAB_001041b5;
    }
LAB_001042a9:
    pvVar9 = (void *)0x0;
  }
  else {
LAB_001041b5:
    puVar5 = (undefined8 *)puVar8[uVar10];
    puVar6 = (undefined8 *)puVar6[uVar10];
    __dest = puVar5;
    if (puVar5 == puVar6) {
      pmVar7 = m->allocator;
      if (pmVar7->num_reserved_extents < 1) {
        __dest = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
      }
      else {
        __dest = (undefined8 *)pmVar7->reserved_extents;
        pmVar7->reserved_extents = (void *)*__dest;
        pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
      }
      if (__dest == (undefined8 *)0x0) goto LAB_001042a9;
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(__dest,puVar5,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      puVar8[uVar10] = __dest;
    }
    puVar5 = (undefined8 *)__dest[uVar11];
    puVar8 = puVar5;
    if (puVar5 == (undefined8 *)puVar6[uVar11]) {
      pmVar7 = m->allocator;
      if (pmVar7->num_reserved_extents < 1) {
        puVar8 = (undefined8 *)(*pmVar7->alloc_func)(pmVar7);
      }
      else {
        puVar8 = (undefined8 *)pmVar7->reserved_extents;
        pmVar7->reserved_extents = (void *)*puVar8;
        pmVar7->num_reserved_extents = pmVar7->num_reserved_extents + -1;
      }
      if (puVar8 == (undefined8 *)0x0) goto LAB_001042a9;
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(puVar8,puVar5,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      __dest[uVar11] = puVar8;
    }
    pvVar9 = (void *)((ulong)((id & uVar3) * m->block_size) + (long)puVar8);
  }
  return pvVar9;
}

Assistant:

void *
matras_touch_no_check(struct matras *m, matras_id_t id)
{
	assert(matras_needs_touch(m, id));

	/* see "Shifts and masks explanation" for details */
	matras_id_t n1 = id >> m->shift1;
	matras_id_t n2 = (id & m->mask1) >> m->shift2;
	matras_id_t n3 = id & m->mask2;

	void **extent1 = (void **)m->head.root;
	void **extent1p = (void **)m->head.prev_view->root;
	if (extent1 == extent1p) {
		void *new_extent = matras_copy_read_view_extent(m, extent1);
		if (!new_extent)
			return 0;
		m->head.root = new_extent;
		extent1 = (void **)new_extent;
	}

	void **extent2 = (void **)extent1[n1];
	void **extent2p = (void **)extent1p[n1];
	if (extent2 == extent2p) {
		void *new_extent = matras_copy_read_view_extent(m, extent2);
		if (!new_extent)
			return 0;
		extent1[n1] = new_extent;
		extent2 = (void **)new_extent;
	}

	char *extent3 = (char *)extent2[n2];
	char *extent3p = (char *)extent2p[n2];
	if (extent3 == extent3p) {
		void *new_extent = matras_copy_read_view_extent(m, extent3);
		if (!new_extent)
			return 0;
		extent2[n2] = new_extent;
		extent3 = (char *)new_extent;
	}

	return &extent3[n3 * m->block_size];
}